

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_archiver.cpp
# Opt level: O2

void __thiscall HuffmanArchiver::zip(HuffmanArchiver *this,istream *cin,ostream *cout)

{
  uint uVar1;
  ulong *puVar2;
  uint uVar3;
  _Bit_type *p_Var4;
  int __fd;
  long *plVar5;
  mapped_type *pmVar6;
  size_t in_RCX;
  size_t __n;
  ulong uVar7;
  ulong *puVar8;
  __node_base *p_Var9;
  uint uVar10;
  BitWriter out;
  vector<bool,_std::allocator<bool>_> full_code;
  HuffTree h_tree;
  unordered_map<char,_std::vector<bool,_std::allocator<bool>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::vector<bool,_std::allocator<bool>_>_>_>_>
  alphabet;
  char c;
  _Bvector_base<std::allocator<bool>_> local_58;
  
  count_data(this,cin);
  HuffTree::HuffTree(&h_tree,&this->_data);
  full_code.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  full_code.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  full_code.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  full_code.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  full_code.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  alphabet._M_h._M_buckets = &alphabet._M_h._M_single_bucket;
  alphabet._M_h._M_bucket_count = 1;
  alphabet._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  alphabet._M_h._M_element_count = 0;
  alphabet._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  alphabet._M_h._M_rehash_policy._M_next_resize = 0;
  alphabet._M_h._M_single_bucket = (__node_base_ptr)0x0;
  HuffTree::get_alphabet
            ((unordered_map<char,_std::vector<bool,_std::allocator<bool>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::vector<bool,_std::allocator<bool>_>_>_>_>
              *)&c,&h_tree);
  std::
  _Hashtable<char,_std::pair<const_char,_std::vector<bool,_std::allocator<bool>_>_>,_std::allocator<std::pair<const_char,_std::vector<bool,_std::allocator<bool>_>_>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::operator=(&alphabet._M_h,
              (_Hashtable<char,_std::pair<const_char,_std::vector<bool,_std::allocator<bool>_>_>,_std::allocator<std::pair<const_char,_std::vector<bool,_std::allocator<bool>_>_>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               *)&c);
  std::
  _Hashtable<char,_std::pair<const_char,_std::vector<bool,_std::allocator<bool>_>_>,_std::allocator<std::pair<const_char,_std::vector<bool,_std::allocator<bool>_>_>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<char,_std::pair<const_char,_std::vector<bool,_std::allocator<bool>_>_>,_std::allocator<std::pair<const_char,_std::vector<bool,_std::allocator<bool>_>_>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&c);
  __fd = HuffTree::get_full_code_size(&h_tree);
  BitWriter::BitWriter(&out,cout);
  BitWriter::write(&out,(int)this->num_of_symbols_in,(void *)0x40,in_RCX);
  BitWriter::write(&out,__fd,(void *)0x20,in_RCX);
  BitWriter::write(&out,(int)alphabet._M_h._M_element_count,(void *)0x10,in_RCX);
  p_Var9 = &alphabet._M_h._M_before_begin;
  while( true ) {
    p_Var9 = p_Var9->_M_nxt;
    if (p_Var9 == (__node_base *)0x0) break;
    BitWriter::write(&out,(int)(char)*(size_type *)(p_Var9 + 1),(void *)0x8,in_RCX);
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)&local_58,
               (vector<bool,_std::allocator<bool>_> *)(p_Var9 + 2));
    get_full_code((vector<bool,_std::allocator<bool>_> *)&c,
                  (vector<bool,_std::allocator<bool>_> *)&local_58,__fd);
    std::vector<bool,_std::allocator<bool>_>::operator=
              (&full_code,(vector<bool,_std::allocator<bool>_> *)&c);
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
              ((_Bvector_base<std::allocator<bool>_> *)&c);
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_58);
    uVar1 = full_code.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_finish.super__Bit_iterator_base._M_offset;
    p_Var4 = full_code.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_p;
    puVar8 = full_code.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p;
    uVar7 = 0;
    while ((uVar10 = (uint)uVar7, puVar8 != p_Var4 || (uVar10 != uVar1))) {
      BitWriter::write(&out,(uint)((*puVar8 >> (uVar7 & 0x3f) & 1) != 0),(void *)0x1,in_RCX);
      puVar8 = puVar8 + (uVar10 == 0x3f);
      in_RCX = (ulong)(uVar10 + 1);
      uVar7 = (ulong)(uVar10 + 1);
      if (uVar10 == 0x3f) {
        in_RCX = 0;
        uVar7 = 0;
      }
    }
  }
  this->used_additional_bytes = (long)(__fd + 8) * alphabet._M_h._M_element_count + 0x70 >> 3;
  while( true ) {
    plVar5 = (long *)std::istream::read((char *)cin,(long)&c);
    __n = *(size_t *)(*plVar5 + -0x18);
    if ((*(byte *)((long)plVar5 + __n + 0x20) & 5) != 0) break;
    pmVar6 = std::__detail::
             _Map_base<char,_std::pair<const_char,_std::vector<bool,_std::allocator<bool>_>_>,_std::allocator<std::pair<const_char,_std::vector<bool,_std::allocator<bool>_>_>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<char,_std::pair<const_char,_std::vector<bool,_std::allocator<bool>_>_>,_std::allocator<std::pair<const_char,_std::vector<bool,_std::allocator<bool>_>_>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&alphabet,&c);
    puVar8 = (pmVar6->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p;
    puVar2 = (pmVar6->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_p;
    uVar1 = (pmVar6->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
            _M_finish.super__Bit_iterator_base._M_offset;
    uVar7 = 0;
    while ((uVar10 = (uint)uVar7, puVar8 != puVar2 || (uVar10 != uVar1))) {
      BitWriter::write(&out,(uint)((*puVar8 >> (uVar7 & 0x3f) & 1) != 0),(void *)0x1,__n);
      puVar8 = puVar8 + (uVar10 == 0x3f);
      uVar3 = uVar10 + 1;
      if (uVar10 == 0x3f) {
        uVar3 = 0;
      }
      __n = (size_t)uVar3;
      uVar7 = __n;
    }
    pmVar6 = std::__detail::
             _Map_base<char,_std::pair<const_char,_std::vector<bool,_std::allocator<bool>_>_>,_std::allocator<std::pair<const_char,_std::vector<bool,_std::allocator<bool>_>_>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<char,_std::pair<const_char,_std::vector<bool,_std::allocator<bool>_>_>,_std::allocator<std::pair<const_char,_std::vector<bool,_std::allocator<bool>_>_>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&alphabet,&c);
    this->num_of_symbols_out =
         (ulong)(pmVar6->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
         this->num_of_symbols_out +
         ((long)(pmVar6->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
         (long)(pmVar6->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data
               ._M_start.super__Bit_iterator_base._M_p) * 8;
  }
  this->num_of_symbols_out = this->num_of_symbols_out + 7 >> 3;
  BitWriter::~BitWriter(&out);
  std::
  _Hashtable<char,_std::pair<const_char,_std::vector<bool,_std::allocator<bool>_>_>,_std::allocator<std::pair<const_char,_std::vector<bool,_std::allocator<bool>_>_>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&alphabet._M_h);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            (&full_code.super__Bvector_base<std::allocator<bool>_>);
  std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>::~unique_ptr
            (&h_tree.root);
  return;
}

Assistant:

void HuffmanArchiver::zip(std::istream &cin, std::ostream &cout) {
    count_data(cin);
    HuffTree h_tree(_data);
    std::vector<bool> full_code;

    std::unordered_map<char, std::vector<bool>> alphabet;
    alphabet = h_tree.get_alphabet();
    int full_code_size = h_tree.get_full_code_size();

    BitWriter out(cout);

    out.write(static_cast<int>(num_of_symbols_in), BITS_IN_SIZE_T);
    out.write(full_code_size, BITS_IN_INT);
    out.write(static_cast<int>(alphabet.size()), ALPHABET_SIZE);
    for (const auto &i : alphabet) {
        out.write(i.first, BITS_IN_BYTE);
        full_code = get_full_code(i.second, full_code_size);
        for (bool bit : full_code) {
            out.write(bit, 1);
        }
    }

    used_additional_bytes = BITS_IN_SIZE_T + ALPHABET_SIZE + alphabet.size() * (BITS_IN_BYTE + full_code_size)
                            + BITS_IN_INT;
    used_additional_bytes /= BITS_IN_BYTE;

    char c;
    while (cin.read(&c, 1)) {
        for (bool bit : alphabet[c]) {
            out.write(bit, 1);
        }
        num_of_symbols_out += alphabet[c].size();
    }
    num_of_symbols_out = (num_of_symbols_out + 7) / 8;
}